

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O1

ex_ex * ex_eval(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  byte bVar1;
  uint uVar2;
  ex_ex *peVar3;
  t_float *ptVar4;
  anon_union_8_5_735de1bb_for_ex_cont aVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  long lVar8;
  anon_union_8_5_735de1bb_for_ex_cont aVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  undefined8 uVar14;
  bool bVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  t_float tVar19;
  anon_union_8_5_735de1bb_for_ex_cont local_78;
  long lStack_70;
  undefined8 local_68;
  anon_union_8_5_735de1bb_for_ex_cont local_58;
  long lStack_50;
  undefined8 local_48;
  t_float local_34;
  
  local_58.v_int = 0;
  lStack_50 = 0;
  local_48 = 0;
  local_68 = 0;
  local_78.v_int = 0;
  lStack_70 = 0;
  if (eptr == (ex_ex *)0x0) {
    return (ex_ex *)0x0;
  }
  uVar11 = eptr->ex_type;
  switch(uVar11) {
  case 1:
    if (optr->ex_type == 0xf) {
      iVar12 = expr->exp_vsize;
      if (iVar12 != 0) {
        lVar8 = (eptr->ex_cont).v_int;
        ptVar4 = (optr->ex_cont).v_vec;
        lVar10 = 0;
        do {
          ptVar4[lVar10] = (float)lVar8;
          lVar10 = lVar10 + 1;
        } while (iVar12 != (int)lVar10);
      }
      goto LAB_001926a0;
    }
    break;
  case 2:
    if (optr->ex_type == 0xf) {
      iVar12 = expr->exp_vsize;
      if (iVar12 != 0) {
        tVar19 = (eptr->ex_cont).v_flt;
        ptVar4 = (optr->ex_cont).v_vec;
        lVar8 = 0;
        do {
          ptVar4[lVar8] = tVar19;
          lVar8 = lVar8 + 1;
        } while (iVar12 != (int)lVar8);
      }
      goto LAB_001926a0;
    }
    break;
  case 3:
    if (eptr[1].ex_type == 0) {
      pcVar13 = "expr: ex_eval: not enough nodes 1\n";
      goto LAB_00192845;
    }
    lVar8 = (eptr->ex_cont).v_int;
    if ((2 < lVar8 - 0xe0015U) && (eptr[2].ex_type == 0)) {
      pcVar13 = "expr: ex_eval: not enough nodes 2\n";
      goto LAB_00192845;
    }
    peVar3 = eptr + 1;
    if (lVar8 < 0xb000e) {
      if (lVar8 < 0x90008) {
        if (lVar8 < 0x60005) {
          if (lVar8 == 0x3001c) {
            peVar3 = eval_store(expr,peVar3,optr,idx);
            return peVar3;
          }
          if (lVar8 != 0x40003) {
            if (lVar8 != 0x50004) {
LAB_00193432:
              uVar11 = (ulong)(uint)(peVar3->ex_cont).v_flt;
              pcVar13 = "expr: ex_print: bad op 0x%x\n";
LAB_001922e6:
              pd_error(expr,pcVar13,uVar11);
              return (ex_ex *)0x0;
            }
            peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
            peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) {
LAB_001979ea:
                  uVar14 = 0x4e2;
                  goto LAB_00197a66;
                }
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              ptVar4 = (optr->ex_cont).v_vec;
              if (lStack_70 - 0xeU < 2) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    if (((int)local_58.v_vec[lVar8] == 0) ||
                       (tVar19 = 1.0, (int)local_78.v_vec[lVar8] == 0)) {
                      tVar19 = 0.0;
                    }
                    ptVar4[lVar8] = tVar19;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (float)((int)local_58.v_vec[lVar8] != 0 && (int)local_78.v_flt != 0);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 1) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (float)((int)local_58.v_vec[lVar8] != 0 && (int)(float)local_78.v_int != 0)
                    ;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
LAB_00194a3f:
              pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
              peVar3 = (ex_ex *)0x0;
            }
            else {
              if (lStack_50 == 2) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_001979ea;
                    optr->ex_type = 0xf;
                    ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar4;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      if (((int)local_58.v_flt == 0) ||
                         (tVar19 = 1.0, (int)local_78.v_vec[lVar8] == 0)) {
                        tVar19 = 0.0;
                      }
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                fVar16 = local_58.v_flt;
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] =
                             (float)((int)local_58.v_flt != 0 && (int)local_78.v_flt != 0);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
LAB_001972cc:
                  uVar7 = (int)local_78.v_flt;
                }
                else {
                  if (lStack_70 != 1) goto LAB_00194a3f;
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] = (float)((int)local_58.v_flt != 0 && local_78.v_flt != 0.0);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
                  uVar7 = local_78.v_flt;
                }
                uVar2 = (uint)((float)uVar7 != 0.0 && (int)fVar16 != 0);
                goto LAB_00197323;
              }
              if (lStack_50 == 1) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_001979ea;
                    optr->ex_type = 0xf;
                    ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar4;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      if (((int)(float)local_58.v_int == 0) ||
                         (tVar19 = 1.0, (int)local_78.v_vec[lVar8] == 0)) {
                        tVar19 = 0.0;
                      }
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] =
                             (float)((int)(float)local_58.v_int != 0 && (int)local_78.v_flt != 0);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
                  fVar16 = (float)local_58.v_int;
                  goto LAB_001972cc;
                }
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] = (float)(local_58.v_flt != 0.0 && local_78.v_flt != 0.0);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 1;
                  aVar5.v_int._1_7_ = 0;
                  aVar5.v_int._0_1_ = local_78.v_flt != 0.0 && local_58.v_flt != 0.0;
                  goto LAB_0019730a;
                }
                goto LAB_00194a3f;
              }
              pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
            }
            uVar14 = 0x4e2;
            goto LAB_00194aee;
          }
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) {
LAB_001979cb:
                uVar14 = 0x4e4;
                goto LAB_00197a66;
              }
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            ptVar4 = (optr->ex_cont).v_vec;
            if (lStack_70 - 0xeU < 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  tVar19 = 1.0;
                  if (((int)local_58.v_vec[lVar8] == 0) &&
                     (tVar19 = 1.0, (int)local_78.v_vec[lVar8] == 0)) {
                    tVar19 = 0.0;
                  }
                  ptVar4[lVar8] = tVar19;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  tVar19 = 1.0;
                  if ((int)local_58.v_vec[lVar8] == 0 && (int)local_78.v_flt == 0) {
                    tVar19 = 0.0;
                  }
                  ptVar4[lVar8] = tVar19;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 1) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  tVar19 = 1.0;
                  if ((int)local_58.v_vec[lVar8] == 0 && (int)(float)local_78.v_int == 0) {
                    tVar19 = 0.0;
                  }
                  ptVar4[lVar8] = tVar19;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
LAB_00194a13:
            pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar3 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_001979cb;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    tVar19 = 1.0;
                    if (((int)local_58.v_flt == 0) &&
                       (tVar19 = 1.0, (int)local_78.v_vec[lVar8] == 0)) {
                      tVar19 = 0.0;
                    }
                    ptVar4[lVar8] = tVar19;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  if ((int)local_78.v_flt == 0 && (int)local_58.v_flt == 0) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = local_58.v_flt;
LAB_00197201:
                if ((int)local_78.v_flt != 0 || (int)(float)uVar7 != 0) {
LAB_001971a6:
                  fVar16 = 1.0;
                  goto LAB_001975d6;
                }
              }
              else {
                if (lStack_70 != 1) goto LAB_00194a13;
                if (optr->ex_type == 0xf) {
                  if (local_78.v_flt == 0.0 && (int)local_58.v_flt == 0) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                if (local_78.v_flt != 0.0 || (int)local_58.v_flt != 0) goto LAB_001971a6;
              }
LAB_0019720a:
              fVar16 = 0.0;
LAB_001975d6:
              (optr->ex_cont).v_flt = fVar16;
              goto LAB_00194af5;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_001979cb;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    tVar19 = 1.0;
                    if (((int)(float)local_58.v_int == 0) &&
                       (tVar19 = 1.0, (int)local_78.v_vec[lVar8] == 0)) {
                      tVar19 = 0.0;
                    }
                    ptVar4[lVar8] = tVar19;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  if ((int)local_78.v_flt == 0 && (int)(float)local_58.v_int == 0) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = (float)local_58.v_int;
                goto LAB_00197201;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_78.v_flt == 0.0 && local_58.v_flt == 0.0) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 1;
                bVar15 = local_78.v_flt == 0.0 && local_58.v_flt == 0.0;
LAB_0019755e:
                aVar9.v_int._1_7_ = 0;
                aVar9.v_int._0_1_ = !bVar15;
                goto LAB_00197561;
              }
              goto LAB_00194a13;
            }
            pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar14 = 0x4e4;
          goto LAB_00194aee;
        }
        if (lVar8 != 0x60005) {
          if (lVar8 != 0x70006) {
            if (lVar8 != 0x80007) goto LAB_00193432;
            peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
            peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) {
LAB_001979f8:
                  uVar14 = 0x4dc;
                  goto LAB_00197a66;
                }
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              ptVar4 = (optr->ex_cont).v_vec;
              if (lStack_70 - 0xeU < 2) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)((int)local_78.v_vec[lVar8] & (int)local_58.v_vec[lVar8])
                    ;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)((int)local_58.v_vec[lVar8] & (int)local_78.v_flt);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 1) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)((int)local_58.v_vec[lVar8] & (int)(float)local_78.v_int)
                    ;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
LAB_00194a55:
              pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
              peVar3 = (ex_ex *)0x0;
            }
            else {
              if (lStack_50 == 2) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_001979f8;
                    optr->ex_type = 0xf;
                    ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar4;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = (float)((int)local_78.v_vec[lVar8] & (int)local_58.v_flt);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] = (float)((int)local_78.v_flt & (int)local_58.v_flt);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
                  uVar7 = local_58.v_flt;
LAB_001972f0:
                  uVar2 = (int)local_78.v_flt & (int)(float)uVar7;
                  goto LAB_00197359;
                }
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] = (float)(int)((int)local_58.v_flt & (uint)local_78.v_flt);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
                  uVar2 = (int)local_58.v_flt & (uint)local_78.v_flt;
                  goto LAB_00197323;
                }
                goto LAB_00194a55;
              }
              if (lStack_50 == 1) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_001979f8;
                    optr->ex_type = 0xf;
                    ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar4;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (float)((int)local_78.v_vec[lVar8] & (int)(float)local_58.v_int);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] = (float)((int)local_78.v_flt & (int)(float)local_58.v_int);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
                  uVar7 = (float)local_58.v_int;
                  goto LAB_001972f0;
                }
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] = (float)(int)((uint)local_78.v_flt & (uint)local_58.v_flt);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 1;
                  uVar2 = (uint)local_78.v_flt & (uint)local_58.v_flt;
                  goto LAB_00197308;
                }
                goto LAB_00194a55;
              }
              pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
            }
            uVar14 = 0x4dc;
            goto LAB_00194aee;
          }
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) {
LAB_001979dc:
                uVar14 = 0x4de;
                goto LAB_00197a66;
              }
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            ptVar4 = (optr->ex_cont).v_vec;
            if (lStack_70 - 0xeU < 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (float)((int)local_78.v_vec[lVar8] ^ (int)local_58.v_vec[lVar8]);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (float)((int)local_58.v_vec[lVar8] ^ (int)local_78.v_flt);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 1) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (float)((int)local_58.v_vec[lVar8] ^ (int)(float)local_78.v_int);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
LAB_00194a29:
            pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar3 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_001979dc;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)((int)local_78.v_vec[lVar8] ^ (int)local_58.v_flt);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = (float)((int)local_78.v_flt ^ (int)local_58.v_flt);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = local_58.v_flt;
LAB_00197220:
                uVar2 = (int)local_78.v_flt ^ (int)(float)uVar7;
                goto LAB_00197359;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = (float)(int)((int)local_58.v_flt ^ (uint)local_78.v_flt);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar2 = (int)local_58.v_flt ^ (uint)local_78.v_flt;
                goto LAB_00197323;
              }
              goto LAB_00194a29;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_001979dc;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)((int)local_78.v_vec[lVar8] ^ (int)(float)local_58.v_int)
                    ;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = (float)((int)local_78.v_flt ^ (int)(float)local_58.v_int);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = (float)local_58.v_int;
                goto LAB_00197220;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = (float)(int)((uint)local_78.v_flt ^ (uint)local_58.v_flt);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 1;
                uVar2 = (uint)local_78.v_flt ^ (uint)local_58.v_flt;
                goto LAB_00197308;
              }
              goto LAB_00194a29;
            }
            pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar14 = 0x4de;
          goto LAB_00194aee;
        }
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type != 0xf) {
            if (optr->ex_type == 0xe) {
LAB_00197a06:
              uVar14 = 0x4e0;
              goto LAB_00197a66;
            }
            optr->ex_type = 0xf;
            ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar4;
          }
          ptVar4 = (optr->ex_cont).v_vec;
          if (lStack_70 - 0xeU < 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = (float)((int)local_78.v_vec[lVar8] | (int)local_58.v_vec[lVar8]);
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = (float)((int)local_58.v_vec[lVar8] | (int)local_78.v_flt);
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 1) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = (float)((int)local_58.v_vec[lVar8] | (int)(float)local_78.v_int);
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
LAB_00194a6b:
          pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar3 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_00197a06;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (float)((int)local_78.v_vec[lVar8] | (int)local_58.v_flt);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)((int)local_78.v_flt | (int)local_58.v_flt);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = local_58.v_flt;
LAB_00197352:
              uVar2 = (int)local_78.v_flt | (int)(float)uVar7;
LAB_00197359:
              fVar16 = (float)(int)uVar2;
              goto LAB_001975d6;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)(int)((int)local_58.v_flt | (uint)local_78.v_flt);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar2 = (int)local_58.v_flt | (uint)local_78.v_flt;
              goto LAB_00197323;
            }
            goto LAB_00194a6b;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_00197a06;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (float)((int)local_78.v_vec[lVar8] | (int)(float)local_58.v_int);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)((int)local_78.v_flt | (int)(float)local_58.v_int);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = (float)local_58.v_int;
              goto LAB_00197352;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)(int)((uint)local_78.v_flt | (uint)local_58.v_flt);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 1;
              uVar2 = (uint)local_78.v_flt | (uint)local_58.v_flt;
LAB_00197308:
              aVar5 = (anon_union_8_5_735de1bb_for_ex_cont)(long)(int)uVar2;
              goto LAB_0019730a;
            }
            goto LAB_00194a6b;
          }
          pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar14 = 0x4e0;
      }
      else {
        switch(lVar8) {
        case 0xa000a:
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) {
LAB_00197a3e:
                uVar14 = 0x4cd;
LAB_00197a66:
                post("expr~: Int. error %d",uVar14);
                abort();
              }
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            ptVar4 = (optr->ex_cont).v_vec;
            if (lStack_70 - 0xeU < 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_78.v_vec[lVar8] <= local_58.v_vec[lVar8]) &
                                0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_78.v_flt <= local_58.v_vec[lVar8]) & 0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 1) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)((float)local_78.v_int <= local_58.v_vec[lVar8]) &
                                0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
LAB_00194ab7:
            pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar3 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a3e;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_78.v_vec[lVar8] <= local_58.v_flt) & 0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_78.v_flt <= local_58.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = local_78.v_flt;
              }
              else {
                if (lStack_70 != 1) goto LAB_00194ab7;
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)((float)local_78.v_int <= local_58.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = (float)local_78.v_int;
              }
              uVar2 = -(uint)((float)uVar7 <= local_58.v_flt);
LAB_001975a4:
              tVar19 = (t_float)(uVar2 & 0x3f800000);
LAB_001975af:
              (optr->ex_cont).v_flt = tVar19;
              goto LAB_00194af5;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a3e;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_78.v_vec[lVar8] <= (float)local_58.v_int) &
                                  0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_78.v_flt <= (float)local_58.v_int) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                bVar15 = local_78.v_flt <= (float)local_58.v_int;
LAB_0019750f:
                fVar16 = (float)(-(uint)bVar15 & 0x3f800000);
                goto LAB_001975d6;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_58.v_int < local_78.v_int) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 1;
                aVar9.v_int._1_7_ = 0;
                aVar9.v_int._0_1_ = local_78.v_int <= local_58.v_int;
LAB_00197561:
                optr->ex_cont = aVar9;
                goto LAB_00194af5;
              }
              goto LAB_00194ab7;
            }
            pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar14 = 0x4cd;
          break;
        case 0xa000b:
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) {
LAB_00197a4c:
                uVar14 = 0x4cb;
                goto LAB_00197a66;
              }
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            ptVar4 = (optr->ex_cont).v_vec;
            if (lStack_70 - 0xeU < 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_78.v_vec[lVar8] < local_58.v_vec[lVar8]) & 0x3f800000
                                );
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_78.v_flt < local_58.v_vec[lVar8]) & 0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 1) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)((float)local_78.v_int < local_58.v_vec[lVar8]) & 0x3f800000
                                );
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
LAB_00194aca:
            pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar3 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a4c;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_78.v_vec[lVar8] < local_58.v_flt) & 0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_78.v_flt < local_58.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = local_78.v_flt;
              }
              else {
                if (lStack_70 != 1) goto LAB_00194aca;
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)((float)local_78.v_int < local_58.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = (float)local_78.v_int;
              }
              uVar2 = -(uint)((float)uVar7 < local_58.v_flt);
              goto LAB_001975a4;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a4c;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_78.v_vec[lVar8] < (float)local_58.v_int) &
                                  0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_78.v_flt < (float)local_58.v_int) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                bVar15 = local_78.v_flt < (float)local_58.v_int;
                goto LAB_0019750f;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_78.v_int < local_58.v_int) {
                    tVar19 = 1.0;
                  }
                  else {
                    tVar19 = 0.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 1;
                aVar9.v_int._1_7_ = 0;
                aVar9.v_int._0_1_ = local_78.v_int < local_58.v_int;
                goto LAB_00197561;
              }
              goto LAB_00194aca;
            }
            pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar14 = 0x4cb;
          break;
        case 0xa000c:
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) {
LAB_00197a14:
                uVar14 = 0x4c9;
                goto LAB_00197a66;
              }
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            ptVar4 = (optr->ex_cont).v_vec;
            if (lStack_70 - 0xeU < 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_58.v_vec[lVar8] <= local_78.v_vec[lVar8]) &
                                0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_58.v_vec[lVar8] <= local_78.v_flt) & 0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 1) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_58.v_vec[lVar8] <= (float)local_78.v_int) &
                                0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
LAB_00194a7e:
            pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar3 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a14;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_58.v_flt <= local_78.v_vec[lVar8]) & 0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_58.v_flt <= local_78.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = local_58.v_flt;
LAB_001973bd:
                uVar2 = -(uint)((float)uVar7 <= local_78.v_flt);
                goto LAB_001975a4;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_58.v_flt <= (float)local_78.v_int) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar2 = -(uint)(local_58.v_flt <= (float)local_78.v_int);
                goto LAB_001975a4;
              }
              goto LAB_00194a7e;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a14;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)((float)local_58.v_int <= local_78.v_vec[lVar8]) &
                                  0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)((float)local_58.v_int <= local_78.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = (float)local_58.v_int;
                goto LAB_001973bd;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_78.v_int < local_58.v_int) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 1;
                aVar9.v_int._1_7_ = 0;
                aVar9.v_int._0_1_ = local_58.v_int <= local_78.v_int;
                goto LAB_00197561;
              }
              goto LAB_00194a7e;
            }
            pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar14 = 0x4c9;
          break;
        case 0xa000d:
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) {
LAB_00197a30:
                uVar14 = 0x4c7;
                goto LAB_00197a66;
              }
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            ptVar4 = (optr->ex_cont).v_vec;
            if (lStack_70 - 0xeU < 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_58.v_vec[lVar8] < local_78.v_vec[lVar8]) & 0x3f800000
                                );
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_58.v_vec[lVar8] < local_78.v_flt) & 0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 1) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_58.v_vec[lVar8] < (float)local_78.v_int) & 0x3f800000
                                );
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
LAB_00194aa4:
            pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar3 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a30;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_58.v_flt < local_78.v_vec[lVar8]) & 0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_58.v_flt < local_78.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = local_58.v_flt;
LAB_0019747a:
                uVar2 = -(uint)((float)uVar7 < local_78.v_flt);
                goto LAB_001975a4;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_58.v_flt < (float)local_78.v_int) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar2 = -(uint)(local_58.v_flt < (float)local_78.v_int);
                goto LAB_001975a4;
              }
              goto LAB_00194aa4;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a30;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)((float)local_58.v_int < local_78.v_vec[lVar8]) &
                                  0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)((float)local_58.v_int < local_78.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = (float)local_58.v_int;
                goto LAB_0019747a;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_58.v_int < local_78.v_int) {
                    tVar19 = 1.0;
                  }
                  else {
                    tVar19 = 0.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 1;
                aVar9.v_int._1_7_ = 0;
                aVar9.v_int._0_1_ = local_58.v_int < local_78.v_int;
                goto LAB_00197561;
              }
              goto LAB_00194aa4;
            }
            pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar14 = 0x4c7;
          break;
        default:
          if (lVar8 != 0x90008) {
            if (lVar8 != 0x90009) goto LAB_00193432;
            peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
            peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) {
LAB_00197a22:
                  uVar14 = 0x4cf;
                  goto LAB_00197a66;
                }
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              ptVar4 = (optr->ex_cont).v_vec;
              if (lStack_70 - 0xeU < 2) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_78.v_vec[lVar8] == local_58.v_vec[lVar8]) &
                                  0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_58.v_vec[lVar8] == local_78.v_flt) & 0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 1) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_58.v_vec[lVar8] == (float)local_78.v_int) &
                                  0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
LAB_00194a91:
              pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
              peVar3 = (ex_ex *)0x0;
            }
            else {
              if (lStack_50 == 2) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_00197a22;
                    optr->ex_type = 0xf;
                    ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar4;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_78.v_vec[lVar8] == local_58.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] =
                             (t_float)(-(uint)(local_78.v_flt == local_58.v_flt) & 0x3f800000);
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
                  uVar7 = local_78.v_flt;
                }
                else {
                  if (lStack_70 != 1) goto LAB_00194a91;
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] =
                             (t_float)(-(uint)((float)local_78.v_int == local_58.v_flt) & 0x3f800000
                                      );
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
                  uVar7 = (float)local_78.v_int;
                }
LAB_00194fdc:
                uVar2 = -(uint)((float)uVar7 == local_58.v_flt);
                goto LAB_001975a4;
              }
              if (lStack_50 == 1) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_00197a22;
                    optr->ex_type = 0xf;
                    ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar4;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_78.v_vec[lVar8] == (float)local_58.v_int) &
                                    0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] =
                             (t_float)(-(uint)((float)local_58.v_int == local_78.v_flt) & 0x3f800000
                                      );
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 2;
                  uVar2 = -(uint)((float)local_58.v_int == local_78.v_flt);
                  goto LAB_001975a4;
                }
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    if (local_58.v_int == local_78.v_int) {
                      tVar19 = 1.0;
                    }
                    else {
                      tVar19 = 0.0;
                    }
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      ptVar4 = (optr->ex_cont).v_vec;
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] = tVar19;
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 1;
                  aVar9.v_int._1_7_ = 0;
                  aVar9.v_int._0_1_ = local_58.v_int == local_78.v_int;
                  goto LAB_00197561;
                }
                goto LAB_00194a91;
              }
              pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
            }
            uVar14 = 0x4cf;
            break;
          }
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) {
LAB_00197a5a:
                uVar14 = 0x4d1;
                goto LAB_00197a66;
              }
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            ptVar4 = (optr->ex_cont).v_vec;
            if (lStack_70 - 0xeU < 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_78.v_vec[lVar8] != local_58.v_vec[lVar8]) &
                                0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_58.v_vec[lVar8] != local_78.v_flt) & 0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 1) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (t_float)(-(uint)(local_58.v_vec[lVar8] != (float)local_78.v_int) &
                                0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
LAB_00194add:
            pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar3 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a5a;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_78.v_vec[lVar8] != local_58.v_flt) & 0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)(local_78.v_flt != local_58.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = local_78.v_flt;
              }
              else {
                if (lStack_70 != 1) goto LAB_00194add;
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)((float)local_78.v_int != local_58.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = (float)local_78.v_int;
              }
              uVar2 = -(uint)((float)uVar7 != local_58.v_flt);
              goto LAB_001975a4;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197a5a;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (t_float)(-(uint)(local_78.v_vec[lVar8] != (float)local_58.v_int) &
                                  0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] =
                           (t_float)(-(uint)((float)local_58.v_int != local_78.v_flt) & 0x3f800000);
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar2 = -(uint)((float)local_58.v_int != local_78.v_flt);
                goto LAB_001975a4;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_58.v_int == local_78.v_int) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 1;
                bVar15 = local_58.v_int == local_78.v_int;
                goto LAB_0019755e;
              }
              goto LAB_00194add;
            }
            pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar14 = 0x4d1;
        }
      }
    }
    else if (lVar8 < 0xd0013) {
      if (lVar8 < 0xc0010) {
        if (lVar8 != 0xb000e) {
          if (lVar8 != 0xb000f) goto LAB_00193432;
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) {
LAB_001979a9:
                uVar14 = 0x4d8;
                goto LAB_00197a66;
              }
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            ptVar4 = (optr->ex_cont).v_vec;
            if (lStack_70 - 0xeU < 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (float)((int)local_58.v_vec[lVar8] <<
                              ((byte)(int)local_78.v_vec[lVar8] & 0x1f));
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (float)((int)local_58.v_vec[lVar8] << ((byte)(int)local_78.v_flt & 0x1f));
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 1) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (float)((int)local_58.v_vec[lVar8] <<
                              ((byte)(int)(float)local_78.v_int & 0x1f));
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
LAB_001949e7:
            pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar3 = (ex_ex *)0x0;
          }
          else {
            uVar7 = local_78.v_flt;
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_001979a9;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (float)((int)local_58.v_flt << ((byte)(int)local_78.v_vec[lVar8] & 0x1f));
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              fVar16 = local_58.v_flt;
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  bVar1 = (byte)(int)(float)uVar7 & 0x1f;
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    uVar11 = (ulong)(uint)(0 << bVar1);
                    do {
                      ptVar4[uVar11] = (float)((int)local_58.v_flt << bVar1);
                      uVar11 = uVar11 + 1;
                    } while (iVar12 != (int)uVar11);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
LAB_00197141:
                uVar6 = (byte)(int)(float)uVar7;
              }
              else {
                if (lStack_70 != 1) goto LAB_001949e7;
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    uVar11 = (ulong)(uint)(0 << (local_78.v_int._0_1_ & 0x1f));
                    do {
                      ptVar4[uVar11] = (float)((int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f))
                      ;
                      uVar11 = uVar11 + 1;
                    } while (iVar12 != (int)uVar11);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar6 = local_78.v_int._0_1_;
              }
              uVar2 = (int)fVar16 << (uVar6 & 0x1f);
              goto LAB_00197323;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_001979a9;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] =
                         (float)((int)(float)local_58.v_int <<
                                ((byte)(int)local_78.v_vec[lVar8] & 0x1f));
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  bVar1 = (byte)(int)(float)uVar7 & 0x1f;
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    uVar11 = (ulong)(uint)(0 << bVar1);
                    do {
                      ptVar4[uVar11] = (float)((int)(float)local_58.v_int << bVar1);
                      uVar11 = uVar11 + 1;
                    } while (iVar12 != (int)uVar11);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                fVar16 = (float)local_58.v_int;
                goto LAB_00197141;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    uVar11 = (ulong)(uint)(0 << (local_78.v_int._0_1_ & 0x1f));
                    do {
                      ptVar4[uVar11] = (float)((int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f))
                      ;
                      uVar11 = uVar11 + 1;
                    } while (iVar12 != (int)uVar11);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 1;
                uVar2 = (int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f);
                goto LAB_00197308;
              }
              goto LAB_001949e7;
            }
            pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar14 = 0x4d8;
          goto LAB_00194aee;
        }
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type != 0xf) {
            if (optr->ex_type == 0xe) {
LAB_00197987:
              uVar14 = 0x4da;
              goto LAB_00197a66;
            }
            optr->ex_type = 0xf;
            ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar4;
          }
          ptVar4 = (optr->ex_cont).v_vec;
          if (lStack_70 - 0xeU < 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] =
                     (float)((int)local_58.v_vec[lVar8] >> ((byte)(int)local_78.v_vec[lVar8] & 0x1f)
                            );
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] =
                     (float)((int)local_58.v_vec[lVar8] >> ((byte)(int)local_78.v_flt & 0x1f));
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 1) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] =
                     (float)((int)local_58.v_vec[lVar8] >> ((byte)(int)(float)local_78.v_int & 0x1f)
                            );
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
LAB_001949bb:
          pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar3 = (ex_ex *)0x0;
        }
        else {
          uVar7 = local_78.v_flt;
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_00197987;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (float)((int)local_58.v_flt >> ((byte)(int)local_78.v_vec[lVar8] & 0x1f));
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            fVar16 = local_58.v_flt;
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                bVar1 = (byte)(int)(float)uVar7 & 0x1f;
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  uVar11 = (ulong)(uint)(0 >> bVar1);
                  do {
                    ptVar4[uVar11] = (float)((int)local_58.v_flt >> bVar1);
                    uVar11 = uVar11 + 1;
                  } while (iVar12 != (int)uVar11);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
LAB_0019706f:
              uVar6 = (byte)(int)(float)uVar7;
            }
            else {
              if (lStack_70 != 1) goto LAB_001949bb;
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  uVar11 = (ulong)(uint)(0 >> (local_78.v_int._0_1_ & 0x1f));
                  do {
                    ptVar4[uVar11] = (float)((int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f));
                    uVar11 = uVar11 + 1;
                  } while (iVar12 != (int)uVar11);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar6 = local_78.v_int._0_1_;
            }
            uVar2 = (int)fVar16 >> (uVar6 & 0x1f);
LAB_00197323:
            fVar16 = (float)(int)uVar2;
            goto LAB_001975d6;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_00197987;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] =
                       (float)((int)(float)local_58.v_int >>
                              ((byte)(int)local_78.v_vec[lVar8] & 0x1f));
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                bVar1 = (byte)(int)(float)uVar7 & 0x1f;
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  uVar11 = (ulong)(uint)(0 >> bVar1);
                  do {
                    ptVar4[uVar11] = (float)((int)(float)local_58.v_int >> bVar1);
                    uVar11 = uVar11 + 1;
                  } while (iVar12 != (int)uVar11);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              fVar16 = (float)local_58.v_int;
              goto LAB_0019706f;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  uVar11 = (ulong)(uint)(0 >> (local_78.v_int._0_1_ & 0x1f));
                  do {
                    ptVar4[uVar11] = (float)((int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f));
                    uVar11 = uVar11 + 1;
                  } while (iVar12 != (int)uVar11);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 1;
              uVar2 = (int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f);
              goto LAB_00197308;
            }
            goto LAB_001949bb;
          }
          pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar14 = 0x4da;
      }
      else if (lVar8 == 0xc0010) {
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type != 0xf) {
            if (optr->ex_type == 0xe) {
LAB_00197976:
              uVar14 = 0x4c5;
              goto LAB_00197a66;
            }
            optr->ex_type = 0xf;
            ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar4;
          }
          ptVar4 = (optr->ex_cont).v_vec;
          if (lStack_70 - 0xeU < 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] - local_78.v_vec[lVar8];
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] - local_78.v_flt;
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 1) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] - (float)local_78.v_int;
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
LAB_001949a5:
          pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar3 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_00197976;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = local_58.v_flt - local_78.v_vec[lVar8];
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = local_58.v_flt - local_78.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = local_58.v_flt;
LAB_00196f90:
              fVar16 = (float)uVar7 - local_78.v_flt;
              goto LAB_001975d6;
            }
            if (lStack_70 != 1) goto LAB_001949a5;
            if (optr->ex_type == 0xf) {
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = local_58.v_flt - (float)local_78.v_int;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            optr->ex_type = 2;
            tVar19 = local_58.v_flt - (float)local_78.v_int;
            goto LAB_001975af;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_00197976;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (float)local_58.v_int - local_78.v_vec[lVar8];
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)local_58.v_int - local_78.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = (float)local_58.v_int;
              goto LAB_00196f90;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)(local_58.v_int - local_78.v_int);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 1;
              aVar5.v_int = local_58.v_int - local_78.v_int;
              goto LAB_0019730a;
            }
            goto LAB_001949a5;
          }
          pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar14 = 0x4c5;
      }
      else {
        if (lVar8 != 0xc0011) {
          if (lVar8 != 0xd0012) goto LAB_00193432;
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
          peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
          if (1 < lStack_50 - 0xeU) {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197965;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                aVar5 = local_78;
                if (0 < expr->exp_vsize) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  iVar12 = (int)local_58.v_flt;
                  lVar8 = 0;
                  do {
                    if ((int)aVar5.v_vec[lVar8] == 0) {
                      ex_dzdetect(expr);
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = (t_float)(iVar12 % (int)aVar5.v_vec[lVar8]);
                    }
                    ptVar4[lVar8] = tVar19;
                    lVar8 = lVar8 + 1;
                  } while ((int)lVar8 < expr->exp_vsize);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  if ((int)local_78.v_flt == 0) {
                    ex_dzdetect(expr);
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = (t_float)((int)local_58.v_flt % (int)local_78.v_flt);
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = (undefined4)local_78.v_flt;
              }
              else {
                if (lStack_70 != 1) goto LAB_0019498f;
                if (optr->ex_type == 0xf) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  if (local_78.v_flt == 0.0) {
                    ex_dzdetect(expr);
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = (t_float)((int)local_58.v_flt % (int)local_78.v_int._0_4_);
                  }
                  iVar12 = expr->exp_vsize;
                  if (0 < iVar12) {
                    lVar8 = 0;
                    do {
                      ptVar4[lVar8] = tVar19;
                      lVar8 = lVar8 + 1;
                    } while (iVar12 != (int)lVar8);
                  }
                  goto LAB_00194af5;
                }
                optr->ex_type = 2;
                uVar7 = local_78.v_flt;
              }
              uVar17 = local_58.v_flt;
              if ((float)uVar7 == 0.0) {
LAB_0019700f:
                ex_dzdetect(expr);
                goto LAB_0019720a;
              }
            }
            else {
              if (lStack_50 != 1) {
                pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
                goto LAB_00194998;
              }
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_00197965;
                  optr->ex_type = 0xf;
                  ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar4;
                }
                aVar5 = local_78;
                if (0 < expr->exp_vsize) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  fVar16 = (float)local_58.v_int;
                  lVar8 = 0;
                  do {
                    if ((int)aVar5.v_vec[lVar8] == 0) {
                      ex_dzdetect(expr);
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = (t_float)((int)fVar16 % (int)aVar5.v_vec[lVar8]);
                    }
                    ptVar4[lVar8] = tVar19;
                    lVar8 = lVar8 + 1;
                  } while ((int)lVar8 < expr->exp_vsize);
                }
                goto LAB_00194af5;
              }
              if (lStack_70 != 2) {
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    ptVar4 = (optr->ex_cont).v_vec;
                    if (local_78.v_flt == 0.0) {
                      ex_dzdetect(expr);
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = (t_float)((int)local_58.v_int._0_4_ % (int)local_78.v_int._0_4_);
                    }
                    iVar12 = expr->exp_vsize;
                    if (0 < iVar12) {
                      lVar8 = 0;
                      do {
                        ptVar4[lVar8] = tVar19;
                        lVar8 = lVar8 + 1;
                      } while (iVar12 != (int)lVar8);
                    }
                    goto LAB_00194af5;
                  }
                  optr->ex_type = 1;
                  if (local_78.v_flt == 0.0) goto LAB_001975b9;
                  aVar5 = (anon_union_8_5_735de1bb_for_ex_cont)
                          (long)((int)local_58.v_int._0_4_ % (int)local_78.v_int._0_4_);
                  goto LAB_0019730a;
                }
                goto LAB_0019498f;
              }
              if (optr->ex_type == 0xf) {
                ptVar4 = (optr->ex_cont).v_vec;
                if ((int)local_78.v_flt == 0) {
                  ex_dzdetect(expr);
                  tVar19 = 0.0;
                }
                else {
                  tVar19 = (t_float)((int)(float)local_58.v_int % (int)local_78.v_flt);
                }
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = tVar19;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = (undefined4)local_78.v_flt;
              if ((float)uVar7 == 0.0) goto LAB_0019700f;
              uVar17 = (float)local_58.v_int;
            }
            fVar16 = (float)((int)(float)uVar17 % (int)uVar7);
            goto LAB_001975d6;
          }
          if (optr->ex_type != 0xf) {
            if (optr->ex_type == 0xe) {
LAB_00197965:
              uVar14 = 0x4ec;
              goto LAB_00197a66;
            }
            optr->ex_type = 0xf;
            ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar4;
          }
          aVar9 = local_58;
          aVar5 = local_78;
          ptVar4 = (optr->ex_cont).v_vec;
          if (lStack_70 - 0xeU < 2) {
            if (0 < expr->exp_vsize) {
              lVar8 = 0;
              do {
                if ((int)aVar5.v_vec[lVar8] == 0) {
                  ex_dzdetect(expr);
                  tVar19 = 0.0;
                }
                else {
                  tVar19 = (t_float)((int)aVar9.v_vec[lVar8] % (int)aVar5.v_vec[lVar8]);
                }
                ptVar4[lVar8] = tVar19;
                lVar8 = lVar8 + 1;
              } while ((int)lVar8 < expr->exp_vsize);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 2) {
            if (0 < expr->exp_vsize) {
              iVar12 = (int)local_78.v_flt;
              lVar8 = 0;
              do {
                if (iVar12 == 0) {
                  ex_dzdetect(expr);
                  tVar19 = 0.0;
                }
                else {
                  tVar19 = (t_float)((int)aVar9.v_vec[lVar8] % iVar12);
                }
                ptVar4[lVar8] = tVar19;
                lVar8 = lVar8 + 1;
              } while ((int)lVar8 < expr->exp_vsize);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 1) {
            if (0 < expr->exp_vsize) {
              fVar16 = (float)local_78.v_int;
              lVar8 = 0;
              do {
                if ((int)fVar16 == 0) {
                  ex_dzdetect(expr);
                  tVar19 = 0.0;
                }
                else {
                  tVar19 = (t_float)((int)aVar9.v_vec[lVar8] % (int)fVar16);
                }
                ptVar4[lVar8] = tVar19;
                lVar8 = lVar8 + 1;
              } while ((int)lVar8 < expr->exp_vsize);
            }
            goto LAB_00194af5;
          }
LAB_0019498f:
          pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar3 = (ex_ex *)0x0;
LAB_00194998:
          uVar14 = 0x4ec;
          goto LAB_00194aee;
        }
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type != 0xf) {
            if (optr->ex_type == 0xe) {
LAB_00197954:
              uVar14 = 0x4c3;
              goto LAB_00197a66;
            }
            optr->ex_type = 0xf;
            ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar4;
          }
          ptVar4 = (optr->ex_cont).v_vec;
          if (lStack_70 - 0xeU < 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] + local_78.v_vec[lVar8];
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] + local_78.v_flt;
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 1) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] + (float)local_78.v_int;
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
LAB_00194979:
          pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar3 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_00197954;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = local_78.v_vec[lVar8] + local_58.v_flt;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = local_58.v_flt + local_78.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = local_58.v_flt;
LAB_00196eb9:
              fVar16 = (float)uVar7 + local_78.v_flt;
              goto LAB_001975d6;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)local_78.v_int + local_58.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              fVar16 = (float)local_78.v_int + local_58.v_flt;
              goto LAB_001975d6;
            }
            goto LAB_00194979;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_00197954;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = local_78.v_vec[lVar8] + (float)local_58.v_int;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)local_58.v_int + local_78.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = (float)local_58.v_int;
              goto LAB_00196eb9;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)(local_78.v_int + local_58.v_int);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 1;
              aVar5.v_int = local_78.v_int + local_58.v_int;
              goto LAB_0019730a;
            }
            goto LAB_00194979;
          }
          pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar14 = 0x4c3;
      }
    }
    else {
      if (0xe0014 < lVar8) {
        if (lVar8 != 0xe0015) {
          if (lVar8 == 0xe0016) {
            peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (float)~(long)local_58.v_vec[lVar8];
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_50 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (iVar12 != 0) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)~(long)local_58.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              fVar16 = (float)~(long)local_58.v_flt;
              goto LAB_001975d6;
            }
            if (lStack_50 != 1) {
              pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
              peVar3 = (ex_ex *)0x0;
              uVar14 = 0x4bd;
              goto LAB_00194aee;
            }
            if (optr->ex_type == 0xf) {
              iVar12 = expr->exp_vsize;
              if (iVar12 != 0) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (float)~local_58.v_int;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            optr->ex_type = 1;
            aVar5.v_int = ~local_58.v_int;
          }
          else {
            if (lVar8 != 0xe0017) goto LAB_00193432;
            peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = (t_float)(-(uint)(local_58.v_vec[lVar8] == 0.0) & 0x3f800000);
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_50 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (iVar12 != 0) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (t_float)(-(uint)(local_58.v_flt == 0.0) & 0x3f800000);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = 0.0;
              goto LAB_00194fdc;
            }
            if (lStack_50 != 1) {
              pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
              peVar3 = (ex_ex *)0x0;
              uVar14 = 0x4bb;
              goto LAB_00194aee;
            }
            if (optr->ex_type == 0xf) {
              if ((void *)local_58.v_int == (void *)0x0) {
                tVar19 = 1.0;
              }
              else {
                tVar19 = 0.0;
              }
              iVar12 = expr->exp_vsize;
              if (iVar12 != 0) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = tVar19;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            optr->ex_type = 1;
            aVar5.v_int._1_7_ = 0;
            aVar5.v_int._0_1_ = (void *)local_58.v_int == (void *)0x0;
          }
LAB_0019730a:
          optr->ex_cont = aVar5;
          goto LAB_00194af5;
        }
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type != 0xf) {
            optr->ex_type = 0xf;
            ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar4;
          }
          iVar12 = expr->exp_vsize;
          if (0 < iVar12) {
            ptVar4 = (optr->ex_cont).v_vec;
            lVar8 = 0;
            do {
              ptVar4[lVar8] = -local_58.v_vec[lVar8];
              lVar8 = lVar8 + 1;
            } while (iVar12 != (int)lVar8);
          }
          goto LAB_00194af5;
        }
        if (lStack_50 == 2) {
          if (optr->ex_type == 0xf) {
            iVar12 = expr->exp_vsize;
            if (iVar12 != 0) {
              ptVar4 = (optr->ex_cont).v_vec;
              lVar8 = 0;
              do {
                ptVar4[lVar8] = -local_58.v_flt;
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          optr->ex_type = 2;
          fVar16 = -local_58.v_flt;
          goto LAB_001975d6;
        }
        if (lStack_50 == 1) {
          if (optr->ex_type == 0xf) {
            iVar12 = expr->exp_vsize;
            if (iVar12 != 0) {
              ptVar4 = (optr->ex_cont).v_vec;
              lVar8 = 0;
              do {
                ptVar4[lVar8] = (float)-local_58.v_int;
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          optr->ex_type = 1;
          aVar5.v_int = -local_58.v_int;
          goto LAB_0019730a;
        }
        pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
        peVar3 = (ex_ex *)0x0;
        uVar14 = 0x4bf;
        goto LAB_00194aee;
      }
      if (lVar8 != 0xd0013) {
        if (lVar8 != 0xd0014) goto LAB_00193432;
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
        peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type != 0xf) {
            if (optr->ex_type == 0xe) {
LAB_001979ba:
              uVar14 = 0x4c1;
              goto LAB_00197a66;
            }
            optr->ex_type = 0xf;
            ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar4;
          }
          ptVar4 = (optr->ex_cont).v_vec;
          if (lStack_70 - 0xeU < 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] * local_78.v_vec[lVar8];
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 2) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] * local_78.v_flt;
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 1) {
            iVar12 = expr->exp_vsize;
            if (0 < iVar12) {
              lVar8 = 0;
              do {
                ptVar4[lVar8] = local_58.v_vec[lVar8] * (float)local_78.v_int;
                lVar8 = lVar8 + 1;
              } while (iVar12 != (int)lVar8);
            }
            goto LAB_00194af5;
          }
LAB_001949fd:
          pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar3 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_001979ba;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = local_78.v_vec[lVar8] * local_58.v_flt;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = local_58.v_flt * local_78.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = local_58.v_flt;
LAB_0019715b:
              fVar16 = (float)uVar7 * local_78.v_flt;
              goto LAB_001975d6;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)local_78.v_int * local_58.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              fVar16 = (float)local_78.v_int * local_58.v_flt;
              goto LAB_001975d6;
            }
            goto LAB_001949fd;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_001979ba;
                optr->ex_type = 0xf;
                ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar4;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                ptVar4 = (optr->ex_cont).v_vec;
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = local_78.v_vec[lVar8] * (float)local_58.v_int;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)local_58.v_int * local_78.v_flt;
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 2;
              uVar7 = (float)local_58.v_int;
              goto LAB_0019715b;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar12 = expr->exp_vsize;
                if (0 < iVar12) {
                  ptVar4 = (optr->ex_cont).v_vec;
                  lVar8 = 0;
                  do {
                    ptVar4[lVar8] = (float)(local_78.v_int * local_58.v_int);
                    lVar8 = lVar8 + 1;
                  } while (iVar12 != (int)lVar8);
                }
                goto LAB_00194af5;
              }
              optr->ex_type = 1;
              aVar5.v_int = local_78.v_int * local_58.v_int;
              goto LAB_0019730a;
            }
            goto LAB_001949fd;
          }
          pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar14 = 0x4c1;
        goto LAB_00194aee;
      }
      peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_58,idx);
      peVar3 = ex_eval(expr,peVar3,(ex_ex *)&local_78,idx);
      if (lStack_50 - 0xeU < 2) {
        if (optr->ex_type != 0xf) {
          if (optr->ex_type == 0xe) {
LAB_00197998:
            uVar14 = 0x4f3;
            goto LAB_00197a66;
          }
          optr->ex_type = 0xf;
          ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
          (optr->ex_cont).v_vec = ptVar4;
        }
        aVar9 = local_58;
        aVar5 = local_78;
        ptVar4 = (optr->ex_cont).v_vec;
        if (lStack_70 - 0xeU < 2) {
          if (0 < expr->exp_vsize) {
            lVar8 = 0;
            do {
              fVar16 = aVar5.v_vec[lVar8];
              if ((fVar16 != 0.0) || (NAN(fVar16))) {
                tVar19 = aVar9.v_vec[lVar8] / fVar16;
              }
              else {
                ex_dzdetect(expr);
                tVar19 = 0.0;
              }
              ptVar4[lVar8] = tVar19;
              lVar8 = lVar8 + 1;
            } while ((int)lVar8 < expr->exp_vsize);
          }
          goto LAB_00194af5;
        }
        if (lStack_70 == 2) {
          if (0 < expr->exp_vsize) {
            lVar8 = 0;
            local_34 = local_78.v_flt;
            uVar7 = local_78.v_flt;
            do {
              if (((float)uVar7 != 0.0) || (NAN((float)uVar7))) {
                tVar19 = aVar9.v_vec[lVar8] / (float)uVar7;
              }
              else {
                ex_dzdetect(expr);
                tVar19 = 0.0;
                uVar7 = local_34;
              }
              ptVar4[lVar8] = tVar19;
              lVar8 = lVar8 + 1;
            } while ((int)lVar8 < expr->exp_vsize);
          }
          goto LAB_00194af5;
        }
        if (lStack_70 == 1) {
          if (0 < expr->exp_vsize) {
            local_34 = (t_float)local_78.v_int;
            lVar8 = 0;
            do {
              if ((void *)aVar5.v_int == (void *)0x0) {
                ex_dzdetect(expr);
                tVar19 = 0.0;
              }
              else {
                tVar19 = aVar9.v_vec[lVar8] / local_34;
              }
              ptVar4[lVar8] = tVar19;
              lVar8 = lVar8 + 1;
            } while ((int)lVar8 < expr->exp_vsize);
          }
          goto LAB_00194af5;
        }
LAB_001949d1:
        pcVar13 = "expr: ex_eval(%d): bad right type %ld\n";
        peVar3 = (ex_ex *)0x0;
      }
      else {
        if (lStack_50 == 2) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) goto LAB_00197998;
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            aVar5 = local_78;
            if (0 < expr->exp_vsize) {
              local_34 = local_58.v_flt;
              ptVar4 = (optr->ex_cont).v_vec;
              lVar8 = 0;
              do {
                fVar16 = aVar5.v_vec[lVar8];
                if ((fVar16 != 0.0) || (NAN(fVar16))) {
                  tVar19 = local_34 / fVar16;
                }
                else {
                  ex_dzdetect(expr);
                  tVar19 = 0.0;
                }
                ptVar4[lVar8] = tVar19;
                lVar8 = lVar8 + 1;
              } while ((int)lVar8 < expr->exp_vsize);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar4 = (optr->ex_cont).v_vec;
              local_34 = 0.0;
              if ((local_78.v_flt != 0.0) || (NAN(local_78.v_flt))) {
                local_34 = local_58.v_flt / local_78.v_flt;
              }
              else {
                ex_dzdetect(expr);
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = local_34;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            optr->ex_type = 2;
            uVar7 = local_58.v_flt;
            if ((local_78.v_flt == 0.0) && (!NAN(local_78.v_flt))) {
LAB_001975c8:
              local_34 = 0.0;
              ex_dzdetect(expr);
              fVar16 = local_34;
              goto LAB_001975d6;
            }
LAB_001970a5:
            local_34 = (float)uVar7 / local_78.v_flt;
            fVar16 = local_34;
            goto LAB_001975d6;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              ptVar4 = (optr->ex_cont).v_vec;
              if ((void *)local_78.v_int == (void *)0x0) {
                ex_dzdetect(expr);
                tVar19 = 0.0;
              }
              else {
                tVar19 = local_58.v_flt / (float)local_78.v_int;
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = tVar19;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            optr->ex_type = 2;
            if ((void *)local_78.v_int != (void *)0x0) {
              fVar16 = local_58.v_flt / (float)local_78.v_int;
              goto LAB_001975d6;
            }
            goto LAB_0019700f;
          }
          goto LAB_001949d1;
        }
        if (lStack_50 == 1) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type != 0xf) {
              if (optr->ex_type == 0xe) goto LAB_00197998;
              optr->ex_type = 0xf;
              ptVar4 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar4;
            }
            aVar5 = local_78;
            if (0 < expr->exp_vsize) {
              local_34 = (t_float)local_58.v_int;
              ptVar4 = (optr->ex_cont).v_vec;
              lVar8 = 0;
              do {
                fVar16 = aVar5.v_vec[lVar8];
                if ((fVar16 != 0.0) || (NAN(fVar16))) {
                  tVar19 = local_34 / fVar16;
                }
                else {
                  ex_dzdetect(expr);
                  tVar19 = 0.0;
                }
                ptVar4[lVar8] = tVar19;
                lVar8 = lVar8 + 1;
              } while ((int)lVar8 < expr->exp_vsize);
            }
            goto LAB_00194af5;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar4 = (optr->ex_cont).v_vec;
              local_34 = 0.0;
              if ((local_78.v_flt != 0.0) || (NAN(local_78.v_flt))) {
                local_34 = (float)local_58.v_int / local_78.v_flt;
              }
              else {
                ex_dzdetect(expr);
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = local_34;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            optr->ex_type = 2;
            if ((local_78.v_flt == 0.0) && (!NAN(local_78.v_flt))) goto LAB_001975c8;
            uVar7 = (float)local_58.v_int;
            goto LAB_001970a5;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              ptVar4 = (optr->ex_cont).v_vec;
              if ((void *)local_78.v_int == (void *)0x0) {
                ex_dzdetect(expr);
                tVar19 = 0.0;
              }
              else {
                tVar19 = (t_float)(local_58.v_int / local_78.v_int);
              }
              iVar12 = expr->exp_vsize;
              if (0 < iVar12) {
                lVar8 = 0;
                do {
                  ptVar4[lVar8] = tVar19;
                  lVar8 = lVar8 + 1;
                } while (iVar12 != (int)lVar8);
              }
              goto LAB_00194af5;
            }
            optr->ex_type = 1;
            if ((void *)local_78.v_int == (void *)0x0) {
LAB_001975b9:
              ex_dzdetect(expr);
              aVar5.v_int = 0;
            }
            else {
              aVar5.v_int = local_58.v_int / local_78.v_int;
            }
            goto LAB_0019730a;
          }
          goto LAB_001949d1;
        }
        pcVar13 = "expr: ex_eval(%d): bad left type %ld\n";
      }
      uVar14 = 0x4f3;
    }
LAB_00194aee:
    pd_error(expr,pcVar13,uVar14);
LAB_00194af5:
    if (lStack_50 == 0xf) {
      free(local_58.v_vec);
    }
    if (lStack_70 != 0xf) {
      return peVar3;
    }
    free(local_78.v_vec);
    return peVar3;
  default:
    pcVar13 = "expr: ex_eval: unexpected type %d\n";
    goto LAB_001922e6;
  case 5:
  case 0xd:
    peVar3 = eval_tab(expr,eptr,optr,idx);
    return peVar3;
  case 6:
    peVar3 = eval_func(expr,eptr,optr,idx);
    return peVar3;
  case 7:
    if (optr->ex_type == 0xf) {
      pcVar13 = "expr: ex_eval: cannot turn string to vector\n";
      goto LAB_00192845;
    }
    break;
  case 8:
    if (optr->ex_type == 0xf) {
      pcVar13 = "expr: IntErr. vsym in for vec out\n";
      goto LAB_00192845;
    }
    if ((eptr->ex_cont).v_int == -1) goto LAB_00192629;
    optr->ex_type = 7;
    goto LAB_0019268d;
  case 0xb:
    if ((eptr->ex_cont).v_int == -1) {
LAB_00192629:
      pcVar13 = "expr: ex_eval: inlet number not set\n";
LAB_00192845:
      pd_error(expr,pcVar13);
      return (ex_ex *)0x0;
    }
    if (optr->ex_type == 0xf) {
      iVar12 = expr->exp_vsize;
      if (iVar12 != 0) {
        lVar8 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_int;
        ptVar4 = (optr->ex_cont).v_vec;
        lVar10 = 0;
        do {
          ptVar4[lVar10] = (float)lVar8;
          lVar10 = lVar10 + 1;
        } while (iVar12 != (int)lVar10);
      }
      goto LAB_001926a0;
    }
    optr->ex_type = 1;
LAB_0019268d:
    optr->ex_cont = expr->exp_var[(eptr->ex_cont).v_int].ex_cont;
    goto LAB_001926a0;
  case 0xc:
    if ((eptr->ex_cont).v_int == -1) goto LAB_00192629;
    if (optr->ex_type == 0xf) {
      iVar12 = expr->exp_vsize;
      if (iVar12 != 0) {
        tVar19 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_flt;
        ptVar4 = (optr->ex_cont).v_vec;
        lVar8 = 0;
        do {
          ptVar4[lVar8] = tVar19;
          lVar8 = lVar8 + 1;
        } while (iVar12 != (int)lVar8);
      }
      goto LAB_001926a0;
    }
    optr->ex_type = 2;
    tVar19 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_flt;
    goto LAB_0019267e;
  case 0xe:
    if (optr->ex_type == 0xf) {
      ptVar4 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec;
      if ((optr->ex_cont).v_vec != ptVar4) {
        memcpy((optr->ex_cont).v_vec,ptVar4,(long)expr->exp_vsize << 2);
      }
      goto LAB_001926a0;
    }
    lVar8 = (eptr->ex_cont).v_int;
    optr->ex_end = expr->exp_var[lVar8].ex_end;
    peVar3 = expr->exp_var + lVar8;
    tVar19 = (peVar3->ex_cont).v_flt;
    uVar7 = *(undefined4 *)((long)&peVar3->ex_cont + 4);
    uVar17 = (undefined4)peVar3->ex_type;
    uVar18 = *(undefined4 *)((long)&peVar3->ex_type + 4);
    goto LAB_00192652;
  case 0xf:
    if (optr->ex_type == 0xf) {
      ptVar4 = (optr->ex_cont).v_vec;
      if (ptVar4 == (eptr->ex_cont).v_vec) {
        post("expr int. error, optr->ex_vec = %d",ptVar4);
        abort();
      }
      memcpy(ptVar4,(eptr->ex_cont).v_vec,(long)expr->exp_vsize << 2);
      free((eptr->ex_cont).v_vec);
    }
    else {
      optr->ex_type = 0xf;
      optr->ex_cont = eptr->ex_cont;
      eptr->ex_type = 1;
      (eptr->ex_cont).v_int = 0;
    }
    goto LAB_001926a0;
  case 0x10:
  case 0x12:
    if (((expr->exp_flags & 3U) == 0) && (optr->ex_type != 0xf)) {
      peVar3 = eval_sigidx(expr,eptr,optr,idx);
      return peVar3;
    }
    pcVar13 = "%d:expr->exp_flags = %d";
    uVar14 = 0x495;
LAB_00197932:
    post(pcVar13,uVar14);
    abort();
  case 0x11:
    optr->ex_type = 2;
    lVar8 = 0x1f98;
    if (idx == 0) {
      idx = expr->exp_vsize;
      lVar8 = 0x1c78;
    }
    tVar19 = *(t_float *)
              (*(long *)((long)expr->exp_outlet + (eptr->ex_cont).v_int * 8 + lVar8 + -0x50) + -4 +
              (long)idx * 4);
    goto LAB_0019267e;
  case 0x14:
    if (((expr->exp_flags & 3U) != 0) || (optr->ex_type == 0xf)) {
      pcVar13 = "%d:exp->exp_flags = %d";
      uVar14 = 0x47d;
      goto LAB_00197932;
    }
    optr->ex_type = 2;
    tVar19 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec[idx];
LAB_0019267e:
    (optr->ex_cont).v_flt = tVar19;
    goto LAB_001926a0;
  case 0x15:
    peVar3 = eval_var(expr,eptr,optr,idx);
    return peVar3;
  }
  optr->ex_end = eptr->ex_end;
  tVar19 = (eptr->ex_cont).v_flt;
  uVar7 = *(undefined4 *)((long)&eptr->ex_cont + 4);
  uVar17 = (undefined4)eptr->ex_type;
  uVar18 = *(undefined4 *)((long)&eptr->ex_type + 4);
LAB_00192652:
  (optr->ex_cont).v_flt = tVar19;
  *(undefined4 *)((long)&optr->ex_cont + 4) = uVar7;
  *(undefined4 *)&optr->ex_type = uVar17;
  *(undefined4 *)((long)&optr->ex_type + 4) = uVar18;
LAB_001926a0:
  return eptr + 1;
}

Assistant:

struct ex_ex *
ex_eval(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
/* the sample number processed for fexpr~ */
{
        int i, j;
        t_float *lp, *rp, *op; /* left, right, and out pointer to vectors */
        t_float scalar;
        int nullret = 0;                /* did we have an error */
        struct ex_ex left = { 0 }, right = { 0 };       /* left and right operands */

        left.ex_type = 0;
        left.ex_int = 0;
        right.ex_type = 0;
        right.ex_int = 0;

        if (!eptr)
                return (exNULL);
        switch (eptr->ex_type) {
        case ET_INT:
                if (optr->ex_type == ET_VEC)
                        ex_mkvector(optr->ex_vec, (t_float) eptr->ex_int,
                                                                expr->exp_vsize);
                else
                        *optr = *eptr;
                return (++eptr);

        case ET_FLT:

                if (optr->ex_type == ET_VEC)
                        ex_mkvector(optr->ex_vec, eptr->ex_flt, expr->exp_vsize);
                else
                        *optr = *eptr;
                return (++eptr);

        case ET_SYM:
                if (optr->ex_type == ET_VEC) {
                        post_error((fts_object_t *) expr,
                              "expr: ex_eval: cannot turn string to vector\n");
                        return (exNULL);
                }
                *optr = *eptr;
                return (++eptr);
        case ET_II:
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                            "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec,
                               (t_float)expr->exp_var[eptr->ex_int].ex_int,
                                                                expr->exp_vsize);
                } else {
                        optr->ex_type = ET_INT;
                        optr->ex_int = expr->exp_var[eptr->ex_int].ex_int;
                }
                return (++eptr);
        case ET_FI:
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                            "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec,
                             expr->exp_var[eptr->ex_int].ex_flt, expr->exp_vsize);
                } else {
                        optr->ex_type = ET_FLT;
                        optr->ex_flt = expr->exp_var[eptr->ex_int].ex_flt;
                }
                return (++eptr);

        case ET_VSYM:
                if (optr->ex_type == ET_VEC) {
                        post_error((fts_object_t *) expr,
                            "expr: IntErr. vsym in for vec out\n");
                        return (exNULL);
                }
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                                "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                optr->ex_type = ET_SYM;
                optr->ex_ptr = expr->exp_var[eptr->ex_int].ex_ptr;
                return(++eptr);

        case ET_VI:
                if (optr->ex_type != ET_VEC)
                        *optr = expr->exp_var[eptr->ex_int];
                else if (optr->ex_vec != expr->exp_var[eptr->ex_int].ex_vec)
                        memcpy(optr->ex_vec, expr->exp_var[eptr->ex_int].ex_vec,
                                        expr->exp_vsize * sizeof (t_float));
                return(++eptr);
        case ET_VEC:
                if (optr->ex_type != ET_VEC) {
                        optr->ex_type = ET_VEC;
                        optr->ex_vec = eptr->ex_vec;
                        eptr->ex_type = ET_INT;
                        eptr->ex_int = 0;
                } else if (optr->ex_vec != eptr->ex_vec) {
                        memcpy(optr->ex_vec, eptr->ex_vec,
                                        expr->exp_vsize * sizeof (t_float));
                        fts_free(eptr->ex_vec);
                } else { /* this should not happen */
                        post("expr int. error, optr->ex_vec = %d",optr->ex_vec);
                        abort();
                }
                return(++eptr);
        case ET_XI0:
                /* short hand for $x?[0] */

                /* SDY delete the following check */
                if (!IS_FEXPR_TILDE(expr) || optr->ex_type==ET_VEC) {
                        post("%d:exp->exp_flags = %d", __LINE__,expr->exp_flags);
                        abort();
                }
                optr->ex_type = ET_FLT;
                optr->ex_flt = expr->exp_var[eptr->ex_int].ex_vec[idx];
                return(++eptr);
        case ET_YOM1:
                /*
                 * short hand for $y?[-1]
                 * if we are calculating the first sample of the vector
                 * we need to look at the previous results buffer
                 */
                optr->ex_type = ET_FLT;
                if (idx == 0)
                        optr->ex_flt =
                        expr->exp_p_res[eptr->ex_int][expr->exp_vsize - 1];
                else
                        optr->ex_flt=expr->exp_tmpres[eptr->ex_int][idx-1];
                return(++eptr);

        case ET_YO:
        case ET_XI:
                /* SDY delete the following */
                if (!IS_FEXPR_TILDE(expr) || optr->ex_type==ET_VEC) {
                        post("%d:expr->exp_flags = %d", __LINE__,expr->exp_flags);
                        abort();
                }
                return (eval_sigidx(expr, eptr, optr, idx));

        case ET_TBL:
        case ET_SI:
                return (eval_tab(expr, eptr, optr, idx));
        case ET_FUNC:
                return (eval_func(expr, eptr, optr, idx));
        case ET_VAR:
                return (eval_var(expr, eptr, optr, idx));
        case ET_OP:
                break;
        case ET_STR:
        case ET_LP:
        case ET_LB:
        default:
                post_error((fts_object_t *) expr,
                        "expr: ex_eval: unexpected type %d\n",
                            (int)eptr->ex_type);
                return (exNULL);
        }
        if (!eptr[1].ex_type) {
                post_error((fts_object_t *) expr,
                                        "expr: ex_eval: not enough nodes 1\n");
                return (exNULL);
        }
        if (!unary_op(eptr->ex_op) && !eptr[2].ex_type) {
                post_error((fts_object_t *) expr,
                                        "expr: ex_eval: not enough nodes 2\n");
                return (exNULL);
        }

        switch((eptr++)->ex_op) {
        case OP_STORE:
                return (eval_store(expr, eptr, optr, idx));
        case OP_NOT:
                EVAL_UNARY(!, +);
        case OP_NEG:
                EVAL_UNARY(~, (long));
        case OP_UMINUS:
                EVAL_UNARY(-, +);
        case OP_MUL:
                EVAL(*);
        case OP_ADD:
                EVAL(+);
        case OP_SUB:
                EVAL(-);
        case OP_LT:
                EVAL(<);
        case OP_LE:
                EVAL(<=);
        case OP_GT:
                EVAL(>);
        case OP_GE:
                EVAL(>=);
        case OP_EQ:
                EVAL(==);
        case OP_NE:
                EVAL(!=);
/*
 * following operators convert their argument to integer
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      (((int)ARG1) OPR ((int)ARG2))
        case OP_SL:
                EVAL(<<);
        case OP_SR:
                EVAL(>>);
        case OP_AND:
                EVAL(&);
        case OP_XOR:
                EVAL(^);
        case OP_OR:
                EVAL(|);
        case OP_LAND:
                EVAL(&&);
        case OP_LOR:
                EVAL(||);
/*
 * for modulo we need to convert to integer and check for divide by zero
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      ((((int)ARG2)?(((int)ARG1) OPR ((int)ARG2)) \
                                                        : (ex_dzdetect(expr),0)))
        case OP_MOD:
                EVAL(%);
/*
 * define the divide by zero check for divide
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      (((ARG2)?(ARG1 OPR ARG2):(ex_dzdetect(expr),0)))
        case OP_DIV:
                EVAL(/);
        case OP_LP:
        case OP_RP:
        case OP_LB:
        case OP_RB:
        case OP_COMMA:
        case OP_SEMI:
        default:
                post_error((fts_object_t *) expr,
                    "expr: ex_print: bad op 0x%x\n", (unsigned)eptr->ex_op);
                return (exNULL);
        }


        /*
         * the left and right nodes could have been transformed to vectors
         * down the chain
         */
        if (left.ex_type == ET_VEC)
                fts_free(left.ex_vec);
        if (right.ex_type == ET_VEC)
                fts_free(right.ex_vec);
        if (nullret)
                return (exNULL);
        else
                return (eptr);
}